

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseElemExprListOpt(WastParser *this,ElemExprVector *out_list)

{
  bool bVar1;
  undefined1 local_68 [8];
  ElemExpr elem_expr;
  ElemExprVector *out_list_local;
  WastParser *this_local;
  
  elem_expr.var.field_2._24_8_ = out_list;
  ElemExpr::ElemExpr((ElemExpr *)local_68);
  while( true ) {
    bVar1 = ParseElemExprOpt(this,(ElemExpr *)local_68);
    if (!bVar1) break;
    std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::push_back
              ((vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_> *)
               elem_expr.var.field_2._24_8_,(value_type *)local_68);
  }
  bVar1 = std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::empty
                    ((vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_> *)
                     elem_expr.var.field_2._24_8_);
  ElemExpr::~ElemExpr((ElemExpr *)local_68);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool WastParser::ParseElemExprListOpt(ElemExprVector* out_list) {
  ElemExpr elem_expr;
  while (ParseElemExprOpt(&elem_expr)) {
    out_list->push_back(elem_expr);
  }
  return !out_list->empty();
}